

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

UINT8 FilePlayCallback(PlayerBase *player,void *userParam,UINT8 evtType,void *evtParam)

{
  uint uVar1;
  UINT32 *curLoop;
  void *evtParam_local;
  UINT8 evtType_local;
  void *userParam_local;
  PlayerBase *player_local;
  
  switch(evtType) {
  case '\x01':
    break;
  case '\x02':
    break;
  case '\x03':
    uVar1 = (*player->_vptr_PlayerBase[0x19])();
    if ((uVar1 & 8) == 0) {
      printf("Loop %u.\n",(ulong)(*evtParam + 1));
    }
    break;
  case '\x04':
    if ((playState & 2) == 0) {
      playState = playState | 2;
      printf("Song End.\n");
    }
  }
  return '\0';
}

Assistant:

static UINT8 FilePlayCallback(PlayerBase* player, void* userParam, UINT8 evtType, void* evtParam)
{
	switch(evtType)
	{
	case PLREVT_START:
		//printf("Playback started.\n");
		break;
	case PLREVT_STOP:
		//printf("Playback stopped.\n");
		break;
	case PLREVT_LOOP:
		{
			UINT32* curLoop = (UINT32*)evtParam;
			if (player->GetState() & PLAYSTATE_SEEK)
				break;
			printf("Loop %u.\n", 1 + *curLoop);
		}
		break;
	case PLREVT_END:
		if (playState & PLAYSTATE_END)
			break;
		playState |= PLAYSTATE_END;
		printf("Song End.\n");
		break;
	}
	return 0x00;
}